

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger_recorders.cpp
# Opt level: O3

unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
MakeStdErrLoaderLogRecorder(void *user_data)

{
  undefined8 *puVar1;
  undefined8 in_RSI;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  puVar1[3] = in_RSI;
  *(undefined4 *)((long)puVar1 + 0xc) = 2;
  puVar1[2] = 0;
  puVar1[4] = 0x1000;
  puVar1[5] = 0xffffffff;
  *puVar1 = &PTR__LoaderLogRecorder_00150a48;
  puVar1[6] = &std::cerr;
  *(undefined1 *)(puVar1 + 1) = 1;
  *(undefined8 **)user_data = puVar1;
  return (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         user_data;
}

Assistant:

std::unique_ptr<LoaderLogRecorder> MakeStdErrLoaderLogRecorder(void* user_data) {
    std::unique_ptr<LoaderLogRecorder> recorder(
        new OstreamLoaderLogRecorder(std::cerr, user_data, XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT));
    return recorder;
}